

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_homedir.c
# Opt level: O2

char * GetEnv(char *variable,char do_expand)

{
  char *pcVar1;
  
  pcVar1 = getenv(variable);
  if ((pcVar1 != (char *)0x0) && (*pcVar1 != '\0')) {
    pcVar1 = strdup(pcVar1);
    return pcVar1;
  }
  return (char *)0x0;
}

Assistant:

static char *GetEnv(const char *variable, char do_expand)
{
  char *env = NULL;
#ifdef WIN32
  char  buf1[1024], buf2[1024];
  DWORD rc;

  /* Don't use getenv(); it doesn't find variable added after program was
   * started. Don't accept truncated results (i.e. rc >= sizeof(buf1)).  */

  rc = GetEnvironmentVariable(variable, buf1, sizeof(buf1));
  if(rc > 0 && rc < sizeof(buf1)) {
    env = buf1;
    variable = buf1;
  }
  if(do_expand && strchr(variable,'%')) {
    /* buf2 == variable if not expanded */
    rc = ExpandEnvironmentStrings (variable, buf2, sizeof(buf2));
    if(rc > 0 && rc < sizeof(buf2) &&
       !strchr(buf2,'%'))    /* no vars still unexpanded */
      env = buf2;
  }
#else
  (void)do_expand;
#ifdef __VMS
  env = getenv(variable);
  if(env && strcmp("HOME",variable) == 0) {
    env = decc_translate_vms(env);
  }
#else
  /* no length control */
  env = getenv(variable);
#endif
#endif
  return (env && env[0]) ? strdup(env) : NULL;
}